

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  ulong *puVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  RTCRayQueryContext *pRVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  RTCIntersectArguments *pRVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  long local_1308;
  int local_12fc;
  RTCFilterFunctionNArguments local_12f8;
  RTCIntersectArguments *local_12c8;
  long local_12c0;
  ulong local_12b8;
  float local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined4 local_129c;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  undefined1 local_1280 [32];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  ulong local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  undefined1 auVar36 [16];
  
  local_fa0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 == 8) {
    return;
  }
  puVar19 = local_f90;
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar34._8_4_ = 0x7fffffff;
  auVar34._0_8_ = 0x7fffffff7fffffff;
  auVar34._12_4_ = 0x7fffffff;
  auVar34 = vandps_avx512vl((undefined1  [16])aVar2,auVar34);
  auVar35._8_4_ = 0x219392ef;
  auVar35._0_8_ = 0x219392ef219392ef;
  auVar35._12_4_ = 0x219392ef;
  uVar30 = vcmpps_avx512vl(auVar34,auVar35,1);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  uStack_f98 = 0;
  auVar34 = vdivps_avx(auVar88,(undefined1  [16])aVar2);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
  bVar5 = (bool)((byte)uVar30 & 1);
  auVar36._0_4_ = (uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * auVar34._0_4_;
  bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar34._4_4_;
  bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar34._8_4_;
  bVar5 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar34._12_4_;
  auVar37._8_4_ = 0x3f7ffffa;
  auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar37._12_4_ = 0x3f7ffffa;
  auVar37 = vmulps_avx512vl(auVar36,auVar37);
  auVar38._8_4_ = 0x3f800003;
  auVar38._0_8_ = 0x3f8000033f800003;
  auVar38._12_4_ = 0x3f800003;
  auVar38 = vmulps_avx512vl(auVar36,auVar38);
  uVar84 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_11d0._4_4_ = uVar84;
  local_11d0._0_4_ = uVar84;
  local_11d0._8_4_ = uVar84;
  local_11d0._12_4_ = uVar84;
  auVar92 = ZEXT1664(local_11d0);
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_11e0._4_4_ = uVar84;
  local_11e0._0_4_ = uVar84;
  local_11e0._8_4_ = uVar84;
  local_11e0._12_4_ = uVar84;
  auVar94 = ZEXT1664(local_11e0);
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_11f0._4_4_ = uVar84;
  local_11f0._0_4_ = uVar84;
  local_11f0._8_4_ = uVar84;
  local_11f0._12_4_ = uVar84;
  auVar95 = ZEXT1664(local_11f0);
  fVar87 = auVar37._0_4_;
  auVar34 = vmovshdup_avx(auVar37);
  local_1210 = vshufps_avx(auVar37,auVar37,0x55);
  auVar99 = ZEXT1664(local_1210);
  auVar35 = vshufpd_avx(auVar37,auVar37,1);
  local_1220 = vshufps_avx(auVar37,auVar37,0xaa);
  auVar100 = ZEXT1664(local_1220);
  fVar76 = auVar38._0_4_;
  local_1240 = vshufps_avx512vl(auVar38,auVar38,0x55);
  auVar104 = ZEXT1664(local_1240);
  local_1250 = vshufps_avx512vl(auVar38,auVar38,0xaa);
  auVar105 = ZEXT1664(local_1250);
  uVar31 = (ulong)(fVar87 < 0.0) * 0x10;
  uVar30 = (ulong)(auVar34._0_4_ < 0.0) << 4 | 0x20;
  uVar32 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x40;
  local_12b8 = uVar31 ^ 0x10;
  local_1260 = vbroadcastss_avx512vl(auVar39);
  auVar106 = ZEXT1664(local_1260);
  uVar84 = auVar40._0_4_;
  auVar78 = ZEXT1664(CONCAT412(uVar84,CONCAT48(uVar84,CONCAT44(uVar84,uVar84))));
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar107 = ZEXT3264(auVar52);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar108 = ZEXT3264(auVar52);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar109 = ZEXT3264(auVar52);
  local_1200 = fVar87;
  fStack_11fc = fVar87;
  fStack_11f8 = fVar87;
  fStack_11f4 = fVar87;
  local_1230 = fVar76;
  fStack_122c = fVar76;
  fStack_1228 = fVar76;
  fStack_1224 = fVar76;
  fVar96 = fVar87;
  fVar97 = fVar87;
  fVar98 = fVar87;
  fVar101 = fVar76;
  fVar102 = fVar76;
  fVar103 = fVar76;
LAB_01eabf8a:
  while (pfVar1 = (float *)(puVar19 + -1), puVar19 = puVar19 + -2,
        *pfVar1 <= (ray->super_RayK<1>).tfar) {
    uVar26 = *puVar19;
    while( true ) {
      if ((uVar26 & 8) != 0) {
        local_12c0 = (ulong)((uint)uVar26 & 0xf) - 8;
        if (local_12c0 == 0) goto LAB_01eacb00;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        local_1308 = 0;
        goto LAB_01eac27f;
      }
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar31),auVar92._0_16_);
      auVar39._0_4_ = fVar87 * auVar34._0_4_;
      auVar39._4_4_ = fVar96 * auVar34._4_4_;
      auVar39._8_4_ = fVar97 * auVar34._8_4_;
      auVar39._12_4_ = fVar98 * auVar34._12_4_;
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar30),auVar94._0_16_);
      auVar40._0_4_ = auVar99._0_4_ * auVar34._0_4_;
      auVar40._4_4_ = auVar99._4_4_ * auVar34._4_4_;
      auVar40._8_4_ = auVar99._8_4_ * auVar34._8_4_;
      auVar40._12_4_ = auVar99._12_4_ * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar39,auVar40);
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar32),auVar95._0_16_);
      auVar80._0_4_ = auVar100._0_4_ * auVar39._0_4_;
      auVar80._4_4_ = auVar100._4_4_ * auVar39._4_4_;
      auVar80._8_4_ = auVar100._8_4_ * auVar39._8_4_;
      auVar80._12_4_ = auVar100._12_4_ * auVar39._12_4_;
      auVar39 = vmaxps_avx512vl(auVar80,auVar106._0_16_);
      auVar34 = vmaxps_avx(auVar34,auVar39);
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + local_12b8),auVar92._0_16_);
      auVar81._0_4_ = fVar76 * auVar39._0_4_;
      auVar81._4_4_ = fVar101 * auVar39._4_4_;
      auVar81._8_4_ = fVar102 * auVar39._8_4_;
      auVar81._12_4_ = fVar103 * auVar39._12_4_;
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar30 ^ 0x10)),auVar94._0_16_);
      auVar39 = vmulps_avx512vl(auVar104._0_16_,auVar39);
      auVar39 = vminps_avx(auVar81,auVar39);
      auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar32 ^ 0x10)),auVar95._0_16_);
      auVar40 = vmulps_avx512vl(auVar105._0_16_,auVar40);
      auVar40 = vminps_avx(auVar40,auVar78._0_16_);
      auVar39 = vminps_avx(auVar39,auVar40);
      uVar33 = vcmpps_avx512vl(auVar34,auVar39,2);
      local_1180._0_16_ = auVar34;
      if ((char)uVar33 == '\0') break;
      uVar22 = uVar26 & 0xfffffffffffffff0;
      lVar25 = 0;
      for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar26 = *(ulong *)(uVar22 + lVar25 * 8);
      uVar24 = (uint)uVar33 - 1 & (uint)uVar33;
      uVar33 = (ulong)uVar24;
      if (uVar24 != 0) {
        uVar28 = *(uint *)(local_1180 + lVar25 * 4);
        lVar25 = 0;
        for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar24 = uVar24 - 1 & uVar24;
        uVar27 = (ulong)uVar24;
        uVar33 = *(ulong *)(uVar22 + lVar25 * 8);
        uVar21 = *(uint *)(local_1180 + lVar25 * 4);
        if (uVar24 == 0) {
          if (uVar28 < uVar21) {
            *puVar19 = uVar33;
            *(uint *)(puVar19 + 1) = uVar21;
            puVar19 = puVar19 + 2;
          }
          else {
            *puVar19 = uVar26;
            *(uint *)(puVar19 + 1) = uVar28;
            puVar19 = puVar19 + 2;
            uVar26 = uVar33;
          }
        }
        else {
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar26;
          auVar34 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar28));
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar33;
          auVar39 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar21));
          lVar25 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar24 = uVar24 - 1 & uVar24;
          uVar26 = (ulong)uVar24;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = *(ulong *)(uVar22 + lVar25 * 8);
          auVar38 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_1180 + lVar25 * 4)));
          auVar40 = vpshufd_avx(auVar34,0xaa);
          auVar35 = vpshufd_avx(auVar39,0xaa);
          auVar37 = vpshufd_avx(auVar38,0xaa);
          if (uVar24 == 0) {
            uVar26 = vpcmpgtd_avx512vl(auVar35,auVar40);
            uVar26 = uVar26 & 0xf;
            auVar35 = vpblendmd_avx512vl(auVar39,auVar34);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar41._0_4_ = (uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * auVar40._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar41._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar40._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar41._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar40._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar41._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar40._12_4_;
            auVar39 = vmovdqa32_avx512vl(auVar39);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar42._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar34._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar42._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar34._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar42._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar34._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar42._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar34._12_4_;
            auVar34 = vpshufd_avx(auVar41,0xaa);
            uVar33 = vpcmpgtd_avx512vl(auVar37,auVar34);
            uVar33 = uVar33 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar38,auVar41);
            bVar5 = (bool)((byte)uVar33 & 1);
            bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
            uVar26 = CONCAT44((uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar34._4_4_,
                              (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar34._0_4_);
            auVar34 = vmovdqa32_avx512vl(auVar38);
            bVar5 = (bool)((byte)uVar33 & 1);
            auVar43._0_4_ = (uint)bVar5 * auVar34._0_4_ | !bVar5 * auVar41._0_4_;
            bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar5 * auVar34._4_4_ | !bVar5 * auVar41._4_4_;
            bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar5 * auVar34._8_4_ | !bVar5 * auVar41._8_4_;
            bVar5 = SUB81(uVar33 >> 3,0);
            auVar43._12_4_ = (uint)bVar5 * auVar34._12_4_ | !bVar5 * auVar41._12_4_;
            auVar34 = vpshufd_avx(auVar43,0xaa);
            auVar39 = vpshufd_avx(auVar42,0xaa);
            uVar33 = vpcmpgtd_avx512vl(auVar34,auVar39);
            uVar33 = uVar33 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar5 = (bool)((byte)uVar33 & 1);
            auVar44._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar34._0_4_;
            bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar34._4_4_;
            bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar34._8_4_;
            bVar5 = SUB81(uVar33 >> 3,0);
            auVar44._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar34._12_4_;
            auVar34 = vmovdqa32_avx512vl(auVar43);
            bVar5 = (bool)((byte)uVar33 & 1);
            bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar33 >> 2) & 1);
            bVar10 = SUB81(uVar33 >> 3,0);
            *(uint *)puVar19 = (uint)bVar5 * auVar34._0_4_ | !bVar5 * auVar42._0_4_;
            *(uint *)((long)puVar19 + 4) = (uint)bVar6 * auVar34._4_4_ | !bVar6 * auVar42._4_4_;
            *(uint *)(puVar19 + 1) = (uint)bVar7 * auVar34._8_4_ | !bVar7 * auVar42._8_4_;
            *(uint *)((long)puVar19 + 0xc) =
                 (uint)bVar10 * auVar34._12_4_ | !bVar10 * auVar42._12_4_;
            *(undefined1 (*) [16])(puVar19 + 2) = auVar44;
            puVar19 = puVar19 + 4;
          }
          else {
            lVar25 = 0;
            for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar24 = *(uint *)(local_1180 + lVar25 * 4);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)(uVar22 + lVar25 * 8);
            auVar36 = vpunpcklqdq_avx(auVar90,ZEXT416(uVar24));
            uVar26 = vpcmpgtd_avx512vl(auVar35,auVar40);
            uVar26 = uVar26 & 0xf;
            auVar35 = vpblendmd_avx512vl(auVar39,auVar34);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar45._0_4_ = (uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * auVar40._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar40._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar40._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar45._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar40._12_4_;
            auVar39 = vmovdqa32_avx512vl(auVar39);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar46._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar34._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar34._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar34._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar46._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar34._12_4_;
            auVar85._4_4_ = uVar24;
            auVar85._0_4_ = uVar24;
            auVar85._8_4_ = uVar24;
            auVar85._12_4_ = uVar24;
            uVar26 = vpcmpgtd_avx512vl(auVar85,auVar37);
            uVar26 = uVar26 & 0xf;
            auVar34 = vpblendmd_avx512vl(auVar36,auVar38);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar47._0_4_ = (uint)bVar5 * auVar34._0_4_ | !bVar5 * uVar24;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar5 * auVar34._4_4_ | !bVar5 * uVar24;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar5 * auVar34._8_4_ | !bVar5 * uVar24;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar47._12_4_ = (uint)bVar5 * auVar34._12_4_ | !bVar5 * uVar24;
            auVar34 = vmovdqa32_avx512vl(auVar36);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar48._0_4_ = (uint)bVar5 * auVar34._0_4_ | (uint)!bVar5 * auVar38._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar5 * auVar34._4_4_ | (uint)!bVar5 * auVar38._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar5 * auVar34._8_4_ | (uint)!bVar5 * auVar38._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar48._12_4_ = (uint)bVar5 * auVar34._12_4_ | (uint)!bVar5 * auVar38._12_4_;
            auVar34 = vpshufd_avx(auVar48,0xaa);
            auVar39 = vpshufd_avx(auVar46,0xaa);
            uVar26 = vpcmpgtd_avx512vl(auVar34,auVar39);
            uVar26 = uVar26 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar48,auVar46);
            bVar5 = (bool)((byte)uVar26 & 1);
            auVar49._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar34._0_4_;
            bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar34._4_4_;
            bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar34._8_4_;
            bVar5 = SUB81(uVar26 >> 3,0);
            auVar49._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar34._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar48);
            bVar5 = (bool)((byte)uVar26 & 1);
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
            bVar11 = SUB81(uVar26 >> 3,0);
            auVar34 = vpshufd_avx(auVar47,0xaa);
            auVar39 = vpshufd_avx(auVar45,0xaa);
            uVar33 = vpcmpgtd_avx512vl(auVar34,auVar39);
            uVar33 = uVar33 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar47,auVar45);
            bVar6 = (bool)((byte)uVar33 & 1);
            bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
            uVar26 = CONCAT44((uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar34._4_4_,
                              (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar34._0_4_);
            auVar34 = vmovdqa32_avx512vl(auVar47);
            bVar6 = (bool)((byte)uVar33 & 1);
            auVar50._0_4_ = (uint)bVar6 * auVar34._0_4_ | !bVar6 * auVar45._0_4_;
            bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar6 * auVar34._4_4_ | !bVar6 * auVar45._4_4_;
            bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar6 * auVar34._8_4_ | !bVar6 * auVar45._8_4_;
            bVar6 = SUB81(uVar33 >> 3,0);
            auVar50._12_4_ = (uint)bVar6 * auVar34._12_4_ | !bVar6 * auVar45._12_4_;
            auVar34 = vpshufd_avx(auVar50,0xaa);
            auVar39 = vpshufd_avx(auVar49,0xaa);
            uVar33 = vpcmpgtd_avx512vl(auVar39,auVar34);
            uVar33 = uVar33 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar49,auVar50);
            bVar6 = (bool)((byte)uVar33 & 1);
            auVar51._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar34._0_4_;
            bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar34._4_4_;
            bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar34._8_4_;
            bVar6 = SUB81(uVar33 >> 3,0);
            auVar51._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar34._12_4_;
            auVar34 = vmovdqa32_avx512vl(auVar49);
            bVar6 = (bool)((byte)uVar33 & 1);
            bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar33 >> 2) & 1);
            bVar12 = SUB81(uVar33 >> 3,0);
            *(uint *)puVar19 = (uint)bVar5 * auVar40._0_4_ | !bVar5 * auVar46._0_4_;
            *(uint *)((long)puVar19 + 4) = (uint)bVar7 * auVar40._4_4_ | !bVar7 * auVar46._4_4_;
            *(uint *)(puVar19 + 1) = (uint)bVar8 * auVar40._8_4_ | !bVar8 * auVar46._8_4_;
            *(uint *)((long)puVar19 + 0xc) =
                 (uint)bVar11 * auVar40._12_4_ | !bVar11 * auVar46._12_4_;
            *(uint *)(puVar19 + 2) = (uint)bVar6 * auVar34._0_4_ | !bVar6 * auVar50._0_4_;
            *(uint *)((long)puVar19 + 0x14) = (uint)bVar10 * auVar34._4_4_ | !bVar10 * auVar50._4_4_
            ;
            *(uint *)(puVar19 + 3) = (uint)bVar9 * auVar34._8_4_ | !bVar9 * auVar50._8_4_;
            *(uint *)((long)puVar19 + 0x1c) =
                 (uint)bVar12 * auVar34._12_4_ | !bVar12 * auVar50._12_4_;
            *(undefined1 (*) [16])(puVar19 + 4) = auVar51;
            puVar19 = puVar19 + 6;
          }
        }
      }
    }
    if (puVar19 == &local_fa0) {
      return;
    }
  }
  goto LAB_01eacb5d;
LAB_01eac27f:
  do {
    lVar20 = local_1308 * 0xe0;
    lVar25 = uVar26 + 0xd0 + lVar20;
    local_11a0 = *(undefined8 *)(lVar25 + 0x10);
    uStack_1198 = *(undefined8 *)(lVar25 + 0x18);
    lVar25 = uVar26 + 0xc0 + lVar20;
    local_fc0 = *(undefined8 *)(lVar25 + 0x10);
    uStack_fb8 = *(undefined8 *)(lVar25 + 0x18);
    uStack_fb0 = local_fc0;
    uStack_fa8 = uStack_fb8;
    uStack_1190 = local_11a0;
    uStack_1188 = uStack_1198;
    auVar52._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x60 + lVar20);
    auVar52._0_16_ = *(undefined1 (*) [16])(uVar26 + lVar20);
    auVar55._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x70 + lVar20);
    auVar55._0_16_ = *(undefined1 (*) [16])(uVar26 + 0x10 + lVar20);
    auVar56._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x80 + lVar20);
    auVar56._0_16_ = *(undefined1 (*) [16])(uVar26 + 0x20 + lVar20);
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0x30 + lVar20);
    auVar59._16_16_ = auVar34;
    auVar59._0_16_ = auVar34;
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0x40 + lVar20);
    auVar60._16_16_ = auVar34;
    auVar60._0_16_ = auVar34;
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0x50 + lVar20);
    auVar61._16_16_ = auVar34;
    auVar61._0_16_ = auVar34;
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0x90 + lVar20);
    auVar62._16_16_ = auVar34;
    auVar62._0_16_ = auVar34;
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0xa0 + lVar20);
    auVar63._16_16_ = auVar34;
    auVar63._0_16_ = auVar34;
    auVar34 = *(undefined1 (*) [16])(uVar26 + 0xb0 + lVar20);
    auVar64._16_16_ = auVar34;
    auVar64._0_16_ = auVar34;
    uVar84 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar65._4_4_ = uVar84;
    auVar65._0_4_ = uVar84;
    auVar65._8_4_ = uVar84;
    auVar65._12_4_ = uVar84;
    auVar65._16_4_ = uVar84;
    auVar65._20_4_ = uVar84;
    auVar65._24_4_ = uVar84;
    auVar65._28_4_ = uVar84;
    auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar84 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar89._4_4_ = uVar84;
    auVar89._0_4_ = uVar84;
    auVar89._8_4_ = uVar84;
    auVar89._12_4_ = uVar84;
    auVar89._16_4_ = uVar84;
    auVar89._20_4_ = uVar84;
    auVar89._24_4_ = uVar84;
    auVar89._28_4_ = uVar84;
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar91._4_4_ = uVar84;
    auVar91._0_4_ = uVar84;
    auVar91._8_4_ = uVar84;
    auVar91._12_4_ = uVar84;
    auVar91._16_4_ = uVar84;
    auVar91._20_4_ = uVar84;
    auVar91._24_4_ = uVar84;
    auVar91._28_4_ = uVar84;
    fVar96 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar93._4_4_ = fVar96;
    auVar93._0_4_ = fVar96;
    auVar93._8_4_ = fVar96;
    auVar93._12_4_ = fVar96;
    auVar93._16_4_ = fVar96;
    auVar93._20_4_ = fVar96;
    auVar93._24_4_ = fVar96;
    auVar93._28_4_ = fVar96;
    auVar52 = vsubps_avx(auVar52,auVar65);
    auVar55 = vsubps_avx512vl(auVar55,auVar53);
    auVar56 = vsubps_avx512vl(auVar56,auVar54);
    auVar57 = vsubps_avx512vl(auVar59,auVar65);
    auVar58 = vsubps_avx512vl(auVar60,auVar53);
    auVar59 = vsubps_avx512vl(auVar61,auVar54);
    auVar74 = vsubps_avx(auVar62,auVar65);
    auVar60 = vsubps_avx512vl(auVar63,auVar53);
    auVar61 = vsubps_avx512vl(auVar64,auVar54);
    auVar53 = vsubps_avx(auVar74,auVar52);
    auVar62 = vsubps_avx512vl(auVar60,auVar55);
    auVar54 = vsubps_avx(auVar61,auVar56);
    auVar63 = vsubps_avx512vl(auVar52,auVar57);
    auVar64 = vsubps_avx512vl(auVar55,auVar58);
    auVar65 = vsubps_avx512vl(auVar56,auVar59);
    auVar66 = vsubps_avx512vl(auVar57,auVar74);
    auVar67 = vsubps_avx512vl(auVar58,auVar60);
    auVar68 = vsubps_avx512vl(auVar59,auVar61);
    auVar73._0_4_ = auVar74._0_4_ + auVar52._0_4_;
    auVar73._4_4_ = auVar74._4_4_ + auVar52._4_4_;
    auVar73._8_4_ = auVar74._8_4_ + auVar52._8_4_;
    auVar73._12_4_ = auVar74._12_4_ + auVar52._12_4_;
    auVar73._16_4_ = auVar74._16_4_ + auVar52._16_4_;
    auVar73._20_4_ = auVar74._20_4_ + auVar52._20_4_;
    auVar73._24_4_ = auVar74._24_4_ + auVar52._24_4_;
    auVar73._28_4_ = auVar74._28_4_ + auVar52._28_4_;
    auVar69 = vaddps_avx512vl(auVar60,auVar55);
    auVar70 = vaddps_avx512vl(auVar61,auVar56);
    auVar71 = vmulps_avx512vl(auVar69,auVar54);
    auVar71 = vfmsub231ps_avx512vl(auVar71,auVar62,auVar70);
    auVar70 = vmulps_avx512vl(auVar70,auVar53);
    auVar72 = vfmsub231ps_avx512vl(auVar70,auVar54,auVar73);
    auVar70._4_4_ = auVar62._4_4_ * auVar73._4_4_;
    auVar70._0_4_ = auVar62._0_4_ * auVar73._0_4_;
    auVar70._8_4_ = auVar62._8_4_ * auVar73._8_4_;
    auVar70._12_4_ = auVar62._12_4_ * auVar73._12_4_;
    auVar70._16_4_ = auVar62._16_4_ * auVar73._16_4_;
    auVar70._20_4_ = auVar62._20_4_ * auVar73._20_4_;
    auVar70._24_4_ = auVar62._24_4_ * auVar73._24_4_;
    auVar70._28_4_ = auVar73._28_4_;
    auVar34 = vfmsub231ps_fma(auVar70,auVar53,auVar69);
    auVar86._0_4_ = fVar96 * auVar34._0_4_;
    auVar86._4_4_ = fVar96 * auVar34._4_4_;
    auVar86._8_4_ = fVar96 * auVar34._8_4_;
    auVar86._12_4_ = fVar96 * auVar34._12_4_;
    auVar86._16_4_ = fVar96 * 0.0;
    auVar86._20_4_ = fVar96 * 0.0;
    auVar86._24_4_ = fVar96 * 0.0;
    auVar86._28_4_ = 0;
    auVar70 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar72);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar89,auVar71);
    auVar69 = vaddps_avx512vl(auVar52,auVar57);
    auVar71 = vaddps_avx512vl(auVar55,auVar58);
    auVar72 = vaddps_avx512vl(auVar56,auVar59);
    auVar73 = vmulps_avx512vl(auVar71,auVar65);
    auVar73 = vfmsub231ps_avx512vl(auVar73,auVar64,auVar72);
    auVar72 = vmulps_avx512vl(auVar72,auVar63);
    auVar72 = vfmsub231ps_avx512vl(auVar72,auVar65,auVar69);
    auVar69 = vmulps_avx512vl(auVar69,auVar64);
    auVar71 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar71);
    auVar69._4_4_ = fVar96 * auVar71._4_4_;
    auVar69._0_4_ = fVar96 * auVar71._0_4_;
    auVar69._8_4_ = fVar96 * auVar71._8_4_;
    auVar69._12_4_ = fVar96 * auVar71._12_4_;
    auVar69._16_4_ = fVar96 * auVar71._16_4_;
    auVar69._20_4_ = fVar96 * auVar71._20_4_;
    auVar69._24_4_ = fVar96 * auVar71._24_4_;
    auVar69._28_4_ = auVar71._28_4_;
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar91,auVar72);
    local_1160 = vfmadd231ps_avx512vl(auVar69,auVar89,auVar73);
    auVar74 = vaddps_avx512vl(auVar57,auVar74);
    auVar69 = vaddps_avx512vl(auVar58,auVar60);
    auVar58 = vaddps_avx512vl(auVar59,auVar61);
    auVar57 = vmulps_avx512vl(auVar69,auVar68);
    auVar59 = vfmsub231ps_avx512vl(auVar57,auVar67,auVar58);
    auVar57._4_4_ = auVar58._4_4_ * auVar66._4_4_;
    auVar57._0_4_ = auVar58._0_4_ * auVar66._0_4_;
    auVar57._8_4_ = auVar58._8_4_ * auVar66._8_4_;
    auVar57._12_4_ = auVar58._12_4_ * auVar66._12_4_;
    auVar57._16_4_ = auVar58._16_4_ * auVar66._16_4_;
    auVar57._20_4_ = auVar58._20_4_ * auVar66._20_4_;
    auVar57._24_4_ = auVar58._24_4_ * auVar66._24_4_;
    auVar57._28_4_ = auVar58._28_4_;
    auVar34 = vfmsub231ps_fma(auVar57,auVar68,auVar74);
    auVar58._4_4_ = auVar74._4_4_ * auVar67._4_4_;
    auVar58._0_4_ = auVar74._0_4_ * auVar67._0_4_;
    auVar58._8_4_ = auVar74._8_4_ * auVar67._8_4_;
    auVar58._12_4_ = auVar74._12_4_ * auVar67._12_4_;
    auVar58._16_4_ = auVar74._16_4_ * auVar67._16_4_;
    auVar58._20_4_ = auVar74._20_4_ * auVar67._20_4_;
    auVar58._24_4_ = auVar74._24_4_ * auVar67._24_4_;
    auVar58._28_4_ = auVar74._28_4_;
    auVar74 = vfmsub231ps_avx512vl(auVar58,auVar66,auVar69);
    auVar74 = vmulps_avx512vl(auVar93,auVar74);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar91,ZEXT1632(auVar34));
    auVar69 = vfmadd231ps_avx512vl(auVar74,auVar89,auVar59);
    auVar71._0_4_ = auVar70._0_4_ + local_1160._0_4_;
    auVar71._4_4_ = auVar70._4_4_ + local_1160._4_4_;
    auVar71._8_4_ = auVar70._8_4_ + local_1160._8_4_;
    auVar71._12_4_ = auVar70._12_4_ + local_1160._12_4_;
    auVar71._16_4_ = auVar70._16_4_ + local_1160._16_4_;
    auVar71._20_4_ = auVar70._20_4_ + local_1160._20_4_;
    auVar71._24_4_ = auVar70._24_4_ + local_1160._24_4_;
    auVar71._28_4_ = auVar70._28_4_ + local_1160._28_4_;
    local_1140 = vaddps_avx512vl(auVar69,auVar71);
    auVar59 = auVar107._0_32_;
    vandps_avx512vl(local_1140,auVar59);
    auVar74._8_4_ = 0x34000000;
    auVar74._0_8_ = 0x3400000034000000;
    auVar74._12_4_ = 0x34000000;
    auVar74._16_4_ = 0x34000000;
    auVar74._20_4_ = 0x34000000;
    auVar74._24_4_ = 0x34000000;
    auVar74._28_4_ = 0x34000000;
    auVar74 = vmulps_avx512vl(local_1140,auVar74);
    auVar57 = vminps_avx512vl(auVar70,local_1160);
    auVar57 = vminps_avx512vl(auVar57,auVar69);
    auVar58 = vxorps_avx512vl(auVar74,auVar108._0_32_);
    uVar13 = vcmpps_avx512vl(auVar57,auVar58,5);
    auVar57 = vmaxps_avx512vl(auVar70,local_1160);
    auVar69 = vmaxps_avx512vl(auVar57,auVar69);
    uVar14 = vcmpps_avx512vl(auVar69,auVar74,2);
    local_10c0 = (byte)uVar13 | (byte)uVar14;
    if (local_10c0 != 0) {
      auVar74 = vmulps_avx512vl(auVar54,auVar64);
      auVar69 = vmulps_avx512vl(auVar53,auVar65);
      auVar57 = vmulps_avx512vl(auVar62,auVar63);
      auVar58 = vmulps_avx512vl(auVar65,auVar67);
      auVar60 = vmulps_avx512vl(auVar63,auVar68);
      auVar61 = vmulps_avx512vl(auVar64,auVar66);
      auVar62 = vfmsub213ps_avx512vl(auVar62,auVar65,auVar74);
      auVar54 = vfmsub213ps_avx512vl(auVar54,auVar63,auVar69);
      auVar53 = vfmsub213ps_avx512vl(auVar53,auVar64,auVar57);
      auVar64 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar58);
      auVar65 = vfmsub213ps_avx512vl(auVar66,auVar65,auVar60);
      auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar61);
      vandps_avx512vl(auVar74,auVar59);
      vandps_avx512vl(auVar58,auVar59);
      uVar33 = vcmpps_avx512vl(auVar63,auVar63,1);
      vandps_avx512vl(auVar69,auVar59);
      vandps_avx512vl(auVar60,auVar59);
      uVar22 = vcmpps_avx512vl(auVar63,auVar63,1);
      vandps_avx512vl(auVar57,auVar59);
      vandps_avx512vl(auVar61,auVar59);
      uVar27 = vcmpps_avx512vl(auVar63,auVar63,1);
      bVar5 = (bool)((byte)uVar33 & 1);
      local_1120._0_4_ = (float)((uint)bVar5 * auVar62._0_4_ | (uint)!bVar5 * auVar64._0_4_);
      bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
      local_1120._4_4_ = (float)((uint)bVar5 * auVar62._4_4_ | (uint)!bVar5 * auVar64._4_4_);
      bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
      local_1120._8_4_ = (float)((uint)bVar5 * auVar62._8_4_ | (uint)!bVar5 * auVar64._8_4_);
      bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
      local_1120._12_4_ = (float)((uint)bVar5 * auVar62._12_4_ | (uint)!bVar5 * auVar64._12_4_);
      bVar5 = (bool)((byte)(uVar33 >> 4) & 1);
      local_1120._16_4_ = (float)((uint)bVar5 * auVar62._16_4_ | (uint)!bVar5 * auVar64._16_4_);
      bVar5 = (bool)((byte)(uVar33 >> 5) & 1);
      local_1120._20_4_ = (float)((uint)bVar5 * auVar62._20_4_ | (uint)!bVar5 * auVar64._20_4_);
      bVar5 = (bool)((byte)(uVar33 >> 6) & 1);
      local_1120._24_4_ = (float)((uint)bVar5 * auVar62._24_4_ | (uint)!bVar5 * auVar64._24_4_);
      bVar5 = SUB81(uVar33 >> 7,0);
      local_1120._28_4_ = (uint)bVar5 * auVar62._28_4_ | (uint)!bVar5 * auVar64._28_4_;
      bVar5 = (bool)((byte)uVar22 & 1);
      local_1100._0_4_ = (float)((uint)bVar5 * auVar54._0_4_ | (uint)!bVar5 * auVar65._0_4_);
      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
      local_1100._4_4_ = (float)((uint)bVar5 * auVar54._4_4_ | (uint)!bVar5 * auVar65._4_4_);
      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
      local_1100._8_4_ = (float)((uint)bVar5 * auVar54._8_4_ | (uint)!bVar5 * auVar65._8_4_);
      bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
      local_1100._12_4_ = (float)((uint)bVar5 * auVar54._12_4_ | (uint)!bVar5 * auVar65._12_4_);
      bVar5 = (bool)((byte)(uVar22 >> 4) & 1);
      local_1100._16_4_ = (float)((uint)bVar5 * auVar54._16_4_ | (uint)!bVar5 * auVar65._16_4_);
      bVar5 = (bool)((byte)(uVar22 >> 5) & 1);
      local_1100._20_4_ = (float)((uint)bVar5 * auVar54._20_4_ | (uint)!bVar5 * auVar65._20_4_);
      bVar5 = (bool)((byte)(uVar22 >> 6) & 1);
      local_1100._24_4_ = (float)((uint)bVar5 * auVar54._24_4_ | (uint)!bVar5 * auVar65._24_4_);
      bVar5 = SUB81(uVar22 >> 7,0);
      local_1100._28_4_ = (uint)bVar5 * auVar54._28_4_ | (uint)!bVar5 * auVar65._28_4_;
      bVar5 = (bool)((byte)uVar27 & 1);
      local_10e0 = (float)((uint)bVar5 * auVar53._0_4_ | (uint)!bVar5 * auVar63._0_4_);
      bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
      fStack_10dc = (float)((uint)bVar5 * auVar53._4_4_ | (uint)!bVar5 * auVar63._4_4_);
      bVar5 = (bool)((byte)(uVar27 >> 2) & 1);
      fStack_10d8 = (float)((uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * auVar63._8_4_);
      bVar5 = (bool)((byte)(uVar27 >> 3) & 1);
      fStack_10d4 = (float)((uint)bVar5 * auVar53._12_4_ | (uint)!bVar5 * auVar63._12_4_);
      bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
      fStack_10d0 = (float)((uint)bVar5 * auVar53._16_4_ | (uint)!bVar5 * auVar63._16_4_);
      bVar5 = (bool)((byte)(uVar27 >> 5) & 1);
      fStack_10cc = (float)((uint)bVar5 * auVar53._20_4_ | (uint)!bVar5 * auVar63._20_4_);
      bVar5 = (bool)((byte)(uVar27 >> 6) & 1);
      fStack_10c8 = (float)((uint)bVar5 * auVar53._24_4_ | (uint)!bVar5 * auVar63._24_4_);
      bVar5 = SUB81(uVar27 >> 7,0);
      uStack_10c4 = (uint)bVar5 * auVar53._28_4_ | (uint)!bVar5 * auVar63._28_4_;
      auVar66._4_4_ = fVar96 * fStack_10dc;
      auVar66._0_4_ = fVar96 * local_10e0;
      auVar66._8_4_ = fVar96 * fStack_10d8;
      auVar66._12_4_ = fVar96 * fStack_10d4;
      auVar66._16_4_ = fVar96 * fStack_10d0;
      auVar66._20_4_ = fVar96 * fStack_10cc;
      auVar66._24_4_ = fVar96 * fStack_10c8;
      auVar66._28_4_ = fVar96;
      auVar34 = vfmadd213ps_fma(auVar91,local_1100,auVar66);
      auVar34 = vfmadd213ps_fma(auVar89,local_1120,ZEXT1632(auVar34));
      auVar69 = ZEXT1632(CONCAT412(auVar34._12_4_ + auVar34._12_4_,
                                   CONCAT48(auVar34._8_4_ + auVar34._8_4_,
                                            CONCAT44(auVar34._4_4_ + auVar34._4_4_,
                                                     auVar34._0_4_ + auVar34._0_4_))));
      auVar67._0_4_ = auVar56._0_4_ * local_10e0;
      auVar67._4_4_ = auVar56._4_4_ * fStack_10dc;
      auVar67._8_4_ = auVar56._8_4_ * fStack_10d8;
      auVar67._12_4_ = auVar56._12_4_ * fStack_10d4;
      auVar67._16_4_ = auVar56._16_4_ * fStack_10d0;
      auVar67._20_4_ = auVar56._20_4_ * fStack_10cc;
      auVar67._24_4_ = auVar56._24_4_ * fStack_10c8;
      auVar67._28_4_ = 0;
      auVar34 = vfmadd213ps_fma(auVar55,local_1100,auVar67);
      auVar39 = vfmadd213ps_fma(auVar52,local_1120,ZEXT1632(auVar34));
      auVar52 = vrcp14ps_avx512vl(auVar69);
      auVar57 = auVar109._0_32_;
      auVar74 = vfnmadd213ps_avx512vl(auVar52,auVar69,auVar57);
      auVar34 = vfmadd132ps_fma(auVar74,auVar52,auVar52);
      local_1280 = ZEXT1632(CONCAT412(auVar34._12_4_ * (auVar39._12_4_ + auVar39._12_4_),
                                      CONCAT48(auVar34._8_4_ * (auVar39._8_4_ + auVar39._8_4_),
                                               CONCAT44(auVar34._4_4_ *
                                                        (auVar39._4_4_ + auVar39._4_4_),
                                                        auVar34._0_4_ *
                                                        (auVar39._0_4_ + auVar39._0_4_)))));
      uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar53._4_4_ = uVar84;
      auVar53._0_4_ = uVar84;
      auVar53._8_4_ = uVar84;
      auVar53._12_4_ = uVar84;
      auVar53._16_4_ = uVar84;
      auVar53._20_4_ = uVar84;
      auVar53._24_4_ = uVar84;
      auVar53._28_4_ = uVar84;
      uVar13 = vcmpps_avx512vl(local_1280,auVar53,0xd);
      auVar52 = vxorps_avx512vl(auVar69,auVar108._0_32_);
      fVar96 = (ray->super_RayK<1>).tfar;
      auVar54._4_4_ = fVar96;
      auVar54._0_4_ = fVar96;
      auVar54._8_4_ = fVar96;
      auVar54._12_4_ = fVar96;
      auVar54._16_4_ = fVar96;
      auVar54._20_4_ = fVar96;
      auVar54._24_4_ = fVar96;
      auVar54._28_4_ = fVar96;
      uVar14 = vcmpps_avx512vl(local_1280,auVar54,2);
      uVar15 = vcmpps_avx512vl(auVar69,auVar52,4);
      local_10c0 = (byte)uVar13 & (byte)uVar14 & (byte)uVar15 & local_10c0;
      uVar24 = (uint)local_10c0;
      if (local_10c0 != 0) {
        local_11c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        uVar28 = vextractps_avx(local_11c0._0_16_,1);
        local_1180 = auVar70;
        local_1060 = local_1280;
        local_fe0 = 0xf0;
        pSVar3 = context->scene;
        auVar68._8_4_ = 0x219392ef;
        auVar68._0_8_ = 0x219392ef219392ef;
        auVar68._12_4_ = 0x219392ef;
        auVar68._16_4_ = 0x219392ef;
        auVar68._20_4_ = 0x219392ef;
        auVar68._24_4_ = 0x219392ef;
        auVar68._28_4_ = 0x219392ef;
        uVar33 = vcmpps_avx512vl(local_1140,auVar68,5);
        auVar52 = vrcp14ps_avx512vl(local_1140);
        auVar74 = vfnmadd213ps_avx512vl(local_1140,auVar52,auVar57);
        auVar74 = vfmadd132ps_avx512vl(auVar74,auVar52,auVar52);
        fVar97 = (float)((uint)((byte)uVar33 & 1) * auVar74._0_4_);
        fVar96 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar74._4_4_);
        fVar103 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar74._8_4_);
        fVar102 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar74._12_4_);
        fVar101 = (float)((uint)((byte)(uVar33 >> 4) & 1) * auVar74._16_4_);
        fVar87 = (float)((uint)((byte)(uVar33 >> 5) & 1) * auVar74._20_4_);
        fVar98 = (float)((uint)((byte)(uVar33 >> 6) & 1) * auVar74._24_4_);
        auVar72._4_4_ = fVar96 * auVar70._4_4_;
        auVar72._0_4_ = fVar97 * auVar70._0_4_;
        auVar72._8_4_ = fVar103 * auVar70._8_4_;
        auVar72._12_4_ = fVar102 * auVar70._12_4_;
        auVar72._16_4_ = fVar101 * auVar70._16_4_;
        auVar72._20_4_ = fVar87 * auVar70._20_4_;
        auVar72._24_4_ = fVar98 * auVar70._24_4_;
        auVar72._28_4_ = auVar70._28_4_;
        auVar74 = vminps_avx512vl(auVar72,auVar57);
        auVar17._4_4_ = fVar96 * local_1160._4_4_;
        auVar17._0_4_ = fVar97 * local_1160._0_4_;
        auVar17._8_4_ = fVar103 * local_1160._8_4_;
        auVar17._12_4_ = fVar102 * local_1160._12_4_;
        auVar17._16_4_ = fVar101 * local_1160._16_4_;
        auVar17._20_4_ = fVar87 * local_1160._20_4_;
        auVar17._24_4_ = fVar98 * local_1160._24_4_;
        auVar17._28_4_ = auVar52._28_4_;
        auVar52 = vminps_avx512vl(auVar17,auVar57);
        auVar53 = vsubps_avx512vl(auVar57,auVar74);
        auVar54 = vsubps_avx512vl(auVar57,auVar52);
        local_1080 = vblendps_avx(auVar52,auVar53,0xf0);
        local_10a0 = vblendps_avx(auVar74,auVar54,0xf0);
        fVar96 = (float)DAT_01fef940;
        fVar97 = DAT_01fef940._4_4_;
        fVar98 = DAT_01fef940._8_4_;
        fVar87 = DAT_01fef940._12_4_;
        fVar101 = DAT_01fef940._16_4_;
        fVar102 = DAT_01fef940._20_4_;
        fVar103 = DAT_01fef940._24_4_;
        local_1040[0] = local_1120._0_4_ * fVar96;
        local_1040[1] = local_1120._4_4_ * fVar97;
        local_1040[2] = local_1120._8_4_ * fVar98;
        local_1040[3] = local_1120._12_4_ * fVar87;
        fStack_1030 = local_1120._16_4_ * fVar101;
        fStack_102c = local_1120._20_4_ * fVar102;
        fStack_1028 = local_1120._24_4_ * fVar103;
        uStack_1024 = local_1120._28_4_;
        local_1020[0] = local_1100._0_4_ * fVar96;
        local_1020[1] = local_1100._4_4_ * fVar97;
        local_1020[2] = local_1100._8_4_ * fVar98;
        local_1020[3] = local_1100._12_4_ * fVar87;
        fStack_1010 = local_1100._16_4_ * fVar101;
        fStack_100c = local_1100._20_4_ * fVar102;
        fStack_1008 = local_1100._24_4_ * fVar103;
        uStack_1004 = local_1100._28_4_;
        local_1000[0] = local_10e0 * fVar96;
        local_1000[1] = fStack_10dc * fVar97;
        local_1000[2] = fStack_10d8 * fVar98;
        local_1000[3] = fStack_10d4 * fVar87;
        fStack_ff0 = fStack_10d0 * fVar101;
        fStack_fec = fStack_10cc * fVar102;
        fStack_fe8 = fStack_10c8 * fVar103;
        uStack_fe4 = uStack_10c4;
        auVar77._8_4_ = 0x7f800000;
        auVar77._0_8_ = 0x7f8000007f800000;
        auVar77._12_4_ = 0x7f800000;
        auVar77._16_4_ = 0x7f800000;
        auVar77._20_4_ = 0x7f800000;
        auVar77._24_4_ = 0x7f800000;
        auVar77._28_4_ = 0x7f800000;
        auVar52 = vblendmps_avx512vl(auVar77,local_1280);
        auVar75._0_4_ =
             (uint)(local_10c0 & 1) * auVar52._0_4_ | (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 1 & 1);
        auVar75._4_4_ = (uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 2 & 1);
        auVar75._8_4_ = (uint)bVar5 * auVar52._8_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 3 & 1);
        auVar75._12_4_ = (uint)bVar5 * auVar52._12_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 4 & 1);
        auVar75._16_4_ = (uint)bVar5 * auVar52._16_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 5 & 1);
        auVar75._20_4_ = (uint)bVar5 * auVar52._20_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)(local_10c0 >> 6 & 1);
        auVar75._24_4_ = (uint)bVar5 * auVar52._24_4_ | (uint)!bVar5 * 0x7f800000;
        auVar75._28_4_ =
             (uint)(local_10c0 >> 7) * auVar52._28_4_ | (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
        auVar52 = vshufps_avx(auVar75,auVar75,0xb1);
        auVar52 = vminps_avx(auVar75,auVar52);
        auVar74 = vshufpd_avx(auVar52,auVar52,5);
        auVar52 = vminps_avx(auVar52,auVar74);
        auVar74 = vpermpd_avx2(auVar52,0x4e);
        auVar52 = vminps_avx(auVar52,auVar74);
        uVar13 = vcmpps_avx512vl(auVar75,auVar52,0);
        uVar21 = uVar24;
        if (((byte)uVar13 & local_10c0) != 0) {
          uVar21 = (uint)((byte)uVar13 & local_10c0);
        }
        bVar18 = 0;
        for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
          bVar18 = bVar18 + 1;
        }
        do {
          uVar21 = *(uint *)((long)&local_fc0 + (ulong)bVar18 * 4);
          pGVar4 = (pSVar3->geometries).items[uVar21].ptr;
          if ((pGVar4->mask & uVar28) == 0) {
            uVar24 = (uint)(byte)(~(byte)(1 << (bVar18 & 0x1f)) & (byte)uVar24);
          }
          else {
            pRVar29 = context->args;
            if (pRVar29->filter == (RTCFilterFunctionN)0x0) {
              pRVar23 = context->user;
              if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar33 = (ulong)bVar18;
                lVar25 = uVar33 * 4;
                fVar96 = *(float *)(local_10a0 + lVar25);
                fVar97 = *(float *)(local_1080 + lVar25);
                (ray->super_RayK<1>).tfar = *(float *)(local_1060 + lVar25);
                (ray->Ng).field_0.field_0.x = local_1040[uVar33];
                (ray->Ng).field_0.field_0.y = local_1020[uVar33];
                (ray->Ng).field_0.field_0.z = local_1000[uVar33];
                ray->u = fVar96;
                ray->v = fVar97;
                ray->primID = *(uint *)((long)&local_11a0 + lVar25);
                ray->geomID = uVar21;
                ray->instID[0] = pRVar23->instID[0];
                ray->instPrimID[0] = pRVar23->instPrimID[0];
                break;
              }
            }
            else {
              pRVar23 = context->user;
            }
            uVar33 = (ulong)((uint)bVar18 * 4);
            local_12b0 = *(float *)((long)local_1040 + uVar33);
            local_12ac = *(undefined4 *)((long)local_1020 + uVar33);
            local_12a8 = *(undefined4 *)((long)local_1000 + uVar33);
            local_12a4 = *(undefined4 *)(local_10a0 + uVar33);
            local_12a0 = *(undefined4 *)(local_1080 + uVar33);
            local_129c = *(undefined4 *)((long)&local_11a0 + uVar33);
            local_1298 = uVar21;
            local_1294 = pRVar23->instID[0];
            local_1290 = pRVar23->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar33);
            local_12fc = -1;
            local_12f8.valid = &local_12fc;
            local_12f8.geometryUserPtr = pGVar4->userPtr;
            local_12f8.context = pRVar23;
            local_12f8.ray = (RTCRayN *)ray;
            local_12f8.hit = (RTCHitN *)&local_12b0;
            local_12f8.N = 1;
            if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01eac95c:
              if ((pRVar29->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar29->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                (*pRVar29->filter)(&local_12f8);
                auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar109 = ZEXT3264(auVar52);
                auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar108 = ZEXT3264(auVar52);
                auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar107 = ZEXT3264(auVar52);
                if (*local_12f8.valid == 0) goto LAB_01eaca1b;
              }
              (((Vec3f *)((long)local_12f8.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_12f8.hit;
              (((Vec3f *)((long)local_12f8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_12f8.hit + 4);
              (((Vec3f *)((long)local_12f8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_12f8.hit + 8);
              *(float *)((long)local_12f8.ray + 0x3c) = *(float *)(local_12f8.hit + 0xc);
              *(float *)((long)local_12f8.ray + 0x40) = *(float *)(local_12f8.hit + 0x10);
              *(float *)((long)local_12f8.ray + 0x44) = *(float *)(local_12f8.hit + 0x14);
              *(float *)((long)local_12f8.ray + 0x48) = *(float *)(local_12f8.hit + 0x18);
              *(float *)((long)local_12f8.ray + 0x4c) = *(float *)(local_12f8.hit + 0x1c);
              *(float *)((long)local_12f8.ray + 0x50) = *(float *)(local_12f8.hit + 0x20);
            }
            else {
              local_12c8 = pRVar29;
              (*pGVar4->intersectionFilterN)(&local_12f8);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar109 = ZEXT3264(auVar52);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar108 = ZEXT3264(auVar52);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar107 = ZEXT3264(auVar52);
              pRVar29 = local_12c8;
              if (*local_12f8.valid != 0) goto LAB_01eac95c;
LAB_01eaca1b:
              (ray->super_RayK<1>).tfar = (float)local_11c0._0_4_;
            }
            fVar96 = (ray->super_RayK<1>).tfar;
            auVar16._4_4_ = fVar96;
            auVar16._0_4_ = fVar96;
            auVar16._8_4_ = fVar96;
            auVar16._12_4_ = fVar96;
            auVar16._16_4_ = fVar96;
            auVar16._20_4_ = fVar96;
            auVar16._24_4_ = fVar96;
            auVar16._28_4_ = fVar96;
            uVar13 = vcmpps_avx512vl(local_1280,auVar16,2);
            uVar24 = (uint)(byte)(~(byte)(1 << (bVar18 & 0x1f)) & (byte)uVar24) & (uint)uVar13;
            uVar28 = (ray->super_RayK<1>).mask;
            local_11c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
          }
          if ((char)uVar24 == '\0') break;
          BVHNIntersector1<4,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,true>>>
          ::intersect();
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar109 = ZEXT3264(auVar52);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar108 = ZEXT3264(auVar52);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar107 = ZEXT3264(auVar52);
          bVar18 = (byte)local_12f8.valid;
        } while( true );
      }
    }
    local_1308 = local_1308 + 1;
  } while (local_1308 != local_12c0);
LAB_01eacb00:
  fVar96 = (ray->super_RayK<1>).tfar;
  auVar78 = ZEXT1664(CONCAT412(fVar96,CONCAT48(fVar96,CONCAT44(fVar96,fVar96))));
  auVar92 = ZEXT1664(local_11d0);
  auVar94 = ZEXT1664(local_11e0);
  auVar95 = ZEXT1664(local_11f0);
  auVar99 = ZEXT1664(local_1210);
  auVar100 = ZEXT1664(local_1220);
  auVar104 = ZEXT1664(local_1240);
  auVar105 = ZEXT1664(local_1250);
  auVar106 = ZEXT1664(local_1260);
  fVar87 = local_1200;
  fVar96 = fStack_11fc;
  fVar97 = fStack_11f8;
  fVar98 = fStack_11f4;
  fVar76 = local_1230;
  fVar101 = fStack_122c;
  fVar102 = fStack_1228;
  fVar103 = fStack_1224;
LAB_01eacb5d:
  if (puVar19 == &local_fa0) {
    return;
  }
  goto LAB_01eabf8a;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }